

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O2

char * __thiscall GEO::Delaunay::index(Delaunay *this,char *__s,int __c)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  allocator local_29;
  string local_28;
  
  uVar2 = (ulong)this->cell_size_;
  uVar3 = (int)__s * this->cell_v_stride_;
  iVar1 = 1;
  do {
    bVar5 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar5) {
      std::__cxx11::string::string
                ((string *)&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.h"
                 ,&local_29);
      geo_should_not_have_reached(&local_28,0x19b0);
    }
    uVar4 = (ulong)uVar3;
    iVar1 = iVar1 + -1;
    uVar3 = uVar3 + 1;
  } while (this->cell_to_v_[uVar4] != __c);
  return (char *)(ulong)(uint)-iVar1;
}

Assistant:

index_t index(index_t c, signed_index_t v) const {
            geo_debug_assert(c < nb_cells());
            geo_debug_assert(v < (signed_index_t) nb_vertices());
            for(index_t iv = 0; iv < cell_size(); iv++) {
                if(cell_vertex(c, iv) == v) {
                    return iv;
                }
            }
            geo_assert_not_reached;
        }